

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

void __thiscall duckdb_re2::Regexp::ParseState::~ParseState(ParseState *this)

{
  Regexp *pRVar1;
  string *this_00;
  Regexp *this_01;
  
  this_01 = this->stacktop_;
  while (this_01 != (Regexp *)0x0) {
    pRVar1 = this_01->down_;
    this_01->down_ = (Regexp *)0x0;
    if (this_01->op_ == '\x16') {
      this_00 = (this_01->arguments).capture.name_;
      if (this_00 != (string *)0x0) {
        std::__cxx11::string::~string((string *)this_00);
      }
      operator_delete(this_00);
    }
    Decref(this_01);
    this_01 = pRVar1;
  }
  return;
}

Assistant:

Regexp::ParseState::~ParseState() {
  Regexp* next;
  for (Regexp* re = stacktop_; re != NULL; re = next) {
    next = re->down_;
    re->down_ = NULL;
    if (re->op() == kLeftParen)
      delete re->arguments.capture.name_;
    re->Decref();
  }
}